

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meaning.h
# Opt level: O3

void __thiscall ReferenceMeaning::Dump(ReferenceMeaning *this,ostream *out)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"(meaning-ref ",0xd);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  return;
}

Assistant:

void Dump(std::ostream &out) override {
    out << "(meaning-ref " << up_index << " " << right_index << ")";
  }